

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_bit(ly_ctx *ctx,yang_type *typ,lys_type_bit *bit,char *value)

{
  int iVar1;
  char *pcVar2;
  int local_34;
  int j;
  int i;
  char *value_local;
  lys_type_bit *bit_local;
  yang_type *typ_local;
  ly_ctx *ctx_local;
  
  typ->base = LY_TYPE_BITS;
  pcVar2 = lydict_insert_zc(ctx,value);
  bit->name = pcVar2;
  iVar1 = lyp_check_identifier(ctx,bit->name,LY_IDENT_SIMPLE,(lys_module *)0x0,(lys_node *)0x0);
  if (iVar1 == 0) {
    for (local_34 = 0; local_34 < (int)((typ->type->info).bits.count - 1); local_34 = local_34 + 1)
    {
      if ((typ->type->info).bits.bit[local_34].name == bit->name) {
        ly_vlog(ctx,LYE_BITS_DUPNAME,LY_VLOG_NONE,(void *)0x0,bit->name);
        goto LAB_0017e4b3;
      }
    }
    ctx_local._4_4_ = 0;
  }
  else {
LAB_0017e4b3:
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int
yang_read_bit(struct ly_ctx *ctx, struct yang_type *typ, struct lys_type_bit *bit, char *value)
{
    int i, j;

    typ->base = LY_TYPE_BITS;
    bit->name = lydict_insert_zc(ctx, value);
    if (lyp_check_identifier(ctx, bit->name, LY_IDENT_SIMPLE, NULL, NULL)) {
        goto error;
    }

    j = typ->type->info.bits.count - 1;
    /* check the name uniqueness */
    for (i = 0; i < j; i++) {
        if (ly_strequal(typ->type->info.bits.bit[i].name, bit->name, 1)) {
            LOGVAL(ctx, LYE_BITS_DUPNAME, LY_VLOG_NONE, NULL, bit->name);
            goto error;
        }
    }
    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}